

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  time_t tVar3;
  ulong uVar4;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  int display_flags;
  int n;
  int i;
  int www;
  int h;
  int w;
  uint local_28;
  int local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  int local_4;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_28 = 0x40;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  al_set_org_name("liballeg.org");
  al_set_app_name("SPEED");
  uVar4 = al_install_system(0x5020700,atexit);
  if ((uVar4 & 1) == 0) {
    fprintf(_stderr,"Could not initialise Allegro.\n");
    local_4 = 1;
  }
  else {
    al_init_primitives_addon();
    for (local_20 = 1; local_20 < in_EDI; local_20 = local_20 + 1) {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_20 * 8),"-cheat");
      if (iVar1 == 0) {
        cheat = -1;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_20 * 8),"-simple");
        if (iVar1 == 0) {
          low_detail = -1;
        }
        else {
          iVar1 = strcmp(*(char **)(in_RSI + (long)local_20 * 8),"-nogrid");
          if (iVar1 == 0) {
            no_grid = -1;
          }
          else {
            iVar1 = strcmp(*(char **)(in_RSI + (long)local_20 * 8),"-nomusic");
            if (iVar1 == 0) {
              no_music = -1;
            }
            else {
              iVar1 = strcmp(*(char **)(in_RSI + (long)local_20 * 8),"-www");
              if (iVar1 == 0) {
                local_1c = -1;
              }
              else {
                iVar1 = strcmp(*(char **)(in_RSI + (long)local_20 * 8),"-fullscreen");
                if (iVar1 == 0) {
                  uVar2 = 0x200;
                  if (local_14 != 0) {
                    uVar2 = 2;
                  }
                  local_28 = uVar2 | local_28;
                }
                else {
                  uVar2 = atoi(*(char **)(in_RSI + (long)local_20 * 8));
                  if (uVar2 == 0) {
                    usage();
                    return 1;
                  }
                  if (local_14 == 0) {
                    local_14 = uVar2;
                    if ((local_28 & 0x200) != 0) {
                      local_28 = local_28 & 0xfffffdff | 2;
                    }
                  }
                  else {
                    bVar5 = local_18 != 0;
                    local_18 = uVar2;
                    if (bVar5) {
                      usage();
                      return 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_1c == 0) {
      if ((local_14 == 0) || (local_18 == 0)) {
        if ((in_EDI != 1) && ((local_28 & 0x200) == 0)) {
          usage();
          return 1;
        }
        local_14 = 0x280;
        local_18 = 0x1e0;
      }
      al_set_new_display_option(0x11,1,2);
      al_set_new_display_option(0x12,4,2);
      al_set_new_display_flags(local_28);
      screen = (ALLEGRO_DISPLAY *)al_create_display(local_14,local_18);
      if (screen == (ALLEGRO_DISPLAY *)0x0) {
        fprintf(_stderr,"Error setting %dx%d display mode\n",(ulong)local_14,(ulong)local_18);
        local_4 = 1;
      }
      else {
        al_init_font_addon();
        al_set_new_bitmap_flags(1);
        font = (ALLEGRO_FONT *)al_create_builtin_font();
        if (font == (ALLEGRO_FONT *)0x0) {
          fprintf(_stderr,"Error creating builtin font\n");
          local_4 = 1;
        }
        else {
          al_set_new_bitmap_flags(0x400);
          font_video = (ALLEGRO_FONT *)al_create_builtin_font();
          if (font_video == (ALLEGRO_FONT *)0x0) {
            fprintf(_stderr,"Error creating builtin font\n");
            local_4 = 1;
          }
          else {
            al_install_keyboard();
            al_install_joystick();
            uVar4 = al_install_audio();
            if (((uVar4 & 1) != 0) && (uVar4 = al_reserve_samples(8), (uVar4 & 1) == 0)) {
              al_uninstall_audio();
            }
            init_input();
            init_sound();
            init_hiscore();
            while (iVar1 = title_screen(), iVar1 != 0) {
              iVar1 = play_game();
              if (iVar1 != 0) {
                show_results();
                score_table();
              }
            }
            shutdown_hiscore();
            shutdown_sound();
            goodbye();
            shutdown_input();
            al_destroy_font(font);
            al_destroy_font(font_video);
            local_4 = 0;
          }
        }
      }
    }
    else {
      printf(
            "\nUnfortunately the built-in web browser feature had to be removed.\n\nI did get it more or less working as of Saturday evening (forms and\nJava were unsupported, but tables and images were mostly rendering ok),\nbut the US Department of Justice felt that this was an unacceptable\nmonopolistic attempt to tie in web browsing functionality to an\nunrelated product, so they threatened me with being sniped at from\nthe top of tall buildings by guys with high powered rifles unless I\nagreed to disable this code.\n\nWe apologise for any inconvenience that this may cause you.\n"
            );
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
   int w = 0, h = 0;
   int www = FALSE;
   int i, n;
   int display_flags = ALLEGRO_GENERATE_EXPOSE_EVENTS;

   srand(time(NULL));
   
   al_set_org_name("liballeg.org");
   al_set_app_name("SPEED");

   if (!al_init()) {
      fprintf(stderr, "Could not initialise Allegro.\n");
      return 1;
   }
   al_init_primitives_addon();

   /* parse the commandline */
   for (i=1; i<argc; i++) {
      if (strcmp(argv[i], "-cheat") == 0) {
         cheat = TRUE;
      }
      else if (strcmp(argv[i], "-simple") == 0) {
         low_detail = TRUE;
      }
      else if (strcmp(argv[i], "-nogrid") == 0) {
         no_grid = TRUE;
      }
      else if (strcmp(argv[i], "-nomusic") == 0) {
         no_music = TRUE;
      }
      else if (strcmp(argv[i], "-www") == 0) {
         www = TRUE;
      }
      else if (strcmp(argv[i], "-fullscreen") == 0) {
         /* if no width is specified, assume fullscreen_window */
         display_flags |= w ? ALLEGRO_FULLSCREEN : ALLEGRO_FULLSCREEN_WINDOW;
      }
      else {
         n = atoi(argv[i]);

         if (!n) {
            usage();
            return 1;
         }

         if (!w) {
            w = n;
            if (display_flags & ALLEGRO_FULLSCREEN_WINDOW) {
               /* toggle from fullscreen_window to fullscreen */
               display_flags &= ~ALLEGRO_FULLSCREEN_WINDOW;
               display_flags |= ALLEGRO_FULLSCREEN;
            }
         }
         else if (!h) {
            h = n;
         }
         else {
            usage();
            return 1;
         }
      }
   }

   /* it's a real shame that I had to take this out! */
   if (www) {
      printf(
	 "\n"
	 "Unfortunately the built-in web browser feature had to be removed.\n"
	 "\n"
	 "I did get it more or less working as of Saturday evening (forms and\n"
	 "Java were unsupported, but tables and images were mostly rendering ok),\n"
	 "but the US Department of Justice felt that this was an unacceptable\n"
	 "monopolistic attempt to tie in web browsing functionality to an\n"
	 "unrelated product, so they threatened me with being sniped at from\n"
	 "the top of tall buildings by guys with high powered rifles unless I\n"
	 "agreed to disable this code.\n"
	 "\n"
	 "We apologise for any inconvenience that this may cause you.\n"
      );

      return 1;
   }
   
   if (!w || !h) {
      if (argc == 1 || (display_flags & ALLEGRO_FULLSCREEN_WINDOW)) {
         w = 640;
         h = 480;
      }
      else {
         usage();
         return 1;
      }
   }

   /* set the screen mode */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 4, ALLEGRO_SUGGEST);

   al_set_new_display_flags(display_flags);
   screen = al_create_display(w, h);
   if (!screen) {
      fprintf(stderr, "Error setting %dx%d display mode\n", w, h);
      return 1;
   }

   /* To avoid performance problems on graphics drivers that don't support
    * drawing to textures, we build up transition screens on memory bitmaps.
    * We need a font loaded into a memory bitmap for those, then a font
    * loaded into a video bitmap for the game view. Blech!
    */
   al_init_font_addon();
   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   font = al_create_builtin_font();
   if (!font) {
      fprintf(stderr, "Error creating builtin font\n");
      return 1;
   }

   al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);
   font_video = al_create_builtin_font();
   if (!font_video) {
      fprintf(stderr, "Error creating builtin font\n");
      return 1;
   }

   /* set up everything else */
   al_install_keyboard();
   al_install_joystick();
   if (al_install_audio()) {
      if (!al_reserve_samples(8))
         al_uninstall_audio();
   }

   init_input();
   init_sound();
   init_hiscore();

   /* the main program body */
   while (title_screen()) {
      if (play_game()) {
	 show_results();
	 score_table();
      }
   }

   /* time to go away now */
   shutdown_hiscore();
   shutdown_sound();

   goodbye();

   shutdown_input();

   al_destroy_font(font);
   al_destroy_font(font_video);

   return 0;
}